

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 UVar1;
  size_t sVar2;
  ZSTD_dictContentType_e dictContentType_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_matchState_t *ms_local;
  ZSTD_compressedBlockState_t *bs_local;
  
  if ((dict == (void *)0x0) || (dictSize < 9)) {
    bs_local = (ZSTD_compressedBlockState_t *)0x0;
  }
  else {
    ZSTD_reset_compressedBlockState(bs);
    if (dictContentType == ZSTD_dct_rawContent) {
      bs_local = (ZSTD_compressedBlockState_t *)
                 ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
    }
    else {
      UVar1 = MEM_readLE32(dict);
      if (UVar1 != 0xec30a437) {
        if (dictContentType == ZSTD_dct_auto) {
          sVar2 = ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
          return sVar2;
        }
        if (dictContentType == ZSTD_dct_fullDict) {
          return 0xffffffffffffffe0;
        }
      }
      bs_local = (ZSTD_compressedBlockState_t *)
                 ZSTD_loadZstdDictionary(bs,ms,params,dict,dictSize,dtlm,workspace);
    }
  }
  return (size_t)bs_local;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}